

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O0

bool __thiscall ON_ParseSettings::IsLeadingWhiteSpace(ON_ParseSettings *this,ON__UINT32 c)

{
  bool bVar1;
  ON__UINT32 c_local;
  ON_ParseSettings *this_local;
  
  bVar1 = IsInteriorWhiteSpace(this,c);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    switch(c) {
    case 10:
      bVar1 = ParseLineFeedAsLeadingWhiteSpace(this);
      if (bVar1) {
        return true;
      }
      break;
    case 0xb:
      bVar1 = ParseVerticalTabAsLeadingWhiteSpace(this);
      if (bVar1) {
        return true;
      }
      break;
    case 0xc:
      bVar1 = ParseFormFeedAsLeadingWhiteSpace(this);
      if (bVar1) {
        return true;
      }
      break;
    case 0xd:
      bVar1 = ParseCarriageReturnAsLeadingWhiteSpace(this);
      if (bVar1) {
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ParseSettings::IsLeadingWhiteSpace(ON__UINT32 c) const
{
  if (IsInteriorWhiteSpace(c))
    return true;

  switch(c)
  {
  case 0x000A: // line feed
    if ( ParseLineFeedAsLeadingWhiteSpace() )
      return true;
    break;

  case 0x000B: // vertical tab
    if ( ParseVerticalTabAsLeadingWhiteSpace() )
      return true;
    break;

  case 0x000C: // form feed
    if ( ParseFormFeedAsLeadingWhiteSpace() )
      return true;
    break;

  case 0x000D: // carriage return
    if ( ParseCarriageReturnAsLeadingWhiteSpace() )
      return true;
    break;
  }

  return false;
}